

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O2

void __thiscall trun::ResultsReportJSON::PrintAssert(ResultsReportJSON *this,AssertErrorItem *aerr)

{
  char *this_00;
  string local_38;
  
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"File\" : \"%s\",",(aerr->file)._M_dataplus._M_p
            );
  this_00 = "\"Line\" : %d,";
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"Line\" : %d,",(ulong)(uint)aerr->line);
  EscapeString(&local_38,(ResultsReportJSON *)this_00,&aerr->message);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"Message\" : \"%s\"",local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  return;
}

Assistant:

void ResultsReportJSON::PrintAssert(const AssertError::AssertErrorItem &aerr) {
    PushIndent();
    WriteLine(R"("File" : "%s",)", aerr.file.c_str());
    WriteLine(R"("Line" : %d,)", aerr.line);
    WriteLine(R"("Message" : "%s")", EscapeString(aerr.message).c_str());
    PopIndent();
}